

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffprec(fitsfile *fptr,char *card,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  int iVar3;
  FITSfile *pFVar4;
  ulong uVar5;
  __int32_t **pp_Var6;
  size_t sVar7;
  long lVar8;
  char tcard [81];
  
  if (0 < *status) {
    return *status;
  }
  pFVar4 = fptr->Fptr;
  if (fptr->HDUposition != pFVar4->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar4 = fptr->Fptr;
  }
  if ((pFVar4->datastart - pFVar4->headend == 0x50) && (iVar2 = ffiblk(fptr,1,0,status), 0 < iVar2))
  {
    return *status;
  }
  strncpy(tcard,card,0x50);
  tcard[0x50] = '\0';
  uVar5 = strlen(tcard);
  for (sVar7 = 0; uVar5 != sVar7; sVar7 = sVar7 + 1) {
    if ((byte)(tcard[sVar7] + 0x81U) < 0xa1) {
      tcard[sVar7] = ' ';
    }
  }
  for (; uVar5 < 0x50; uVar5 = uVar5 + 1) {
    tcard[uVar5] = ' ';
  }
  sVar7 = strcspn(tcard,"=");
  iVar2 = (int)sVar7;
  if ((int)sVar7 == 0x50) {
    iVar2 = 8;
  }
  iVar3 = fits_strncasecmp("COMMENT ",tcard,8);
  if ((((iVar3 == 0) || (iVar3 = fits_strncasecmp("HISTORY ",tcard,8), iVar3 == 0)) ||
      (iVar3 = fits_strncasecmp("        ",tcard,8), iVar3 == 0)) ||
     (iVar3 = fits_strncasecmp("CONTINUE",tcard,8), iVar3 == 0)) {
    iVar2 = 8;
  }
  for (lVar8 = 0; iVar2 != lVar8; lVar8 = lVar8 + 1) {
    pp_Var6 = __ctype_toupper_loc();
    tcard[lVar8] = (char)(*pp_Var6)[tcard[lVar8]];
  }
  fftkey(tcard,status);
  ffmbyt(fptr,fptr->Fptr->headend,1,status);
  ffpbyt(fptr,0x50,tcard,status);
  iVar2 = *status;
  if (iVar2 < 1) {
    pLVar1 = &fptr->Fptr->headend;
    *pLVar1 = *pLVar1 + 0x50;
  }
  return iVar2;
}

Assistant:

int ffprec(fitsfile *fptr,     /* I - FITS file pointer        */
           const char *card,   /* I - string to be written     */
           int *status)        /* IO - error status            */
/*
  write a keyword record (80 bytes long) to the end of the header
*/
{
    char tcard[FLEN_CARD];
    size_t len, ii;
    long nblocks;
    int keylength;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* no room */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* insert 2880-byte block */
            return(*status);  
    }

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");   /* support for free-format keywords */
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", tcard, 8) || !fits_strncasecmp( "HISTORY ", tcard, 8) ||
         !fits_strncasecmp( "        ", tcard, 8) || !fits_strncasecmp( "CONTINUE", tcard, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);  */        /* test rest of keyword for legal chars */

    ffmbyt(fptr, (fptr->Fptr)->headend, IGNORE_EOF, status); /* move to end */

    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    if (*status <= 0)
       (fptr->Fptr)->headend += 80;    /* update end-of-header position */

    return(*status);
}